

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::Equals,false,false,true,true>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  bool bVar2;
  idx_t iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  
  puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  uVar7 = 0;
  uVar11 = 0;
  lVar9 = 0;
  iVar3 = 0;
  do {
    if (uVar7 == count + 0x3f >> 6) {
      return iVar3;
    }
    if (puVar1 == (unsigned_long *)0x0) {
      uVar8 = uVar11 + 0x40;
      if (count <= uVar11 + 0x40) {
        uVar8 = count;
      }
LAB_00391f4d:
      lVar4 = uVar11 * 4 + 2;
      for (; uVar11 < uVar8; uVar11 = uVar11 + 1) {
        uVar5 = uVar11;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar5 = (ulong)sel->sel_vector[uVar11];
        }
        bVar12 = *(long *)((long)&ldata->lower + lVar4 * 4) ==
                 *(long *)((long)&rdata->lower + lVar4 * 4);
        bVar2 = *(long *)((long)ldata + lVar4 * 4 + -8) == *(long *)((long)rdata + lVar4 * 4 + -8);
        true_sel->sel_vector[iVar3] = (sel_t)uVar5;
        iVar3 = iVar3 + (bVar12 && bVar2);
        false_sel->sel_vector[lVar9] = (sel_t)uVar5;
        lVar9 = lVar9 + (ulong)(!bVar12 || !bVar2);
        lVar4 = lVar4 + 4;
      }
    }
    else {
      uVar5 = puVar1[uVar7];
      uVar8 = uVar11 + 0x40;
      if (count <= uVar11 + 0x40) {
        uVar8 = count;
      }
      if (uVar5 == 0xffffffffffffffff) goto LAB_00391f4d;
      uVar10 = uVar11;
      if (uVar5 == 0) {
        for (; uVar11 = uVar8, uVar10 < uVar8; uVar10 = uVar10 + 1) {
          uVar11 = uVar10;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar11 = (ulong)sel->sel_vector[uVar10];
          }
          false_sel->sel_vector[lVar9] = (sel_t)uVar11;
          lVar9 = lVar9 + 1;
        }
      }
      else {
        lVar4 = uVar11 * 4 + 2;
        uVar10 = 0;
        for (; uVar11 < uVar8; uVar11 = uVar11 + 1) {
          uVar6 = uVar11;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar6 = (ulong)sel->sel_vector[uVar11];
          }
          if ((uVar5 >> (uVar10 & 0x3f) & 1) == 0) {
            bVar12 = false;
          }
          else {
            bVar12 = *(long *)((long)&ldata->lower + lVar4 * 4) ==
                     *(long *)((long)&rdata->lower + lVar4 * 4) &&
                     *(long *)((long)ldata + lVar4 * 4 + -8) ==
                     *(long *)((long)rdata + lVar4 * 4 + -8);
          }
          true_sel->sel_vector[iVar3] = (sel_t)uVar6;
          iVar3 = iVar3 + bVar12;
          false_sel->sel_vector[lVar9] = (sel_t)uVar6;
          lVar9 = lVar9 + (ulong)(bVar12 ^ 1);
          uVar10 = uVar10 + 1;
          lVar4 = lVar4 + 4;
        }
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}